

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

htab_hash_t str_key_hash(tab_str_t str,void *arg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = str.key;
  uVar5 = SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar4,8) +
          SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar4,0) ^ 0x24;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar5 = SUB168(auVar1 * ZEXT816(0x288eea216831e6a7),8) +
          SUB168(auVar1 * ZEXT816(0x288eea216831e6a7),0) ^ uVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar5 = SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),8) +
          SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  return (uint)uVar5 ^
         SUB164(auVar3 * ZEXT816(0x288eea216831e6a7),8) +
         SUB164(auVar3 * ZEXT816(0x288eea216831e6a7),0);
}

Assistant:

static htab_hash_t str_key_hash (tab_str_t str, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash64 (str.key, 0x24);
}